

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O1

void __thiscall cmExtraCodeLiteGenerator::Generate(cmExtraCodeLiteGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  cmGlobalGenerator *pcVar8;
  long *plVar9;
  size_type *psVar10;
  long *plVar11;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string workspaceProjectName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string workspaceOutputDir;
  string workspaceFileName;
  string workspaceSourcePath;
  string filename;
  string projectName;
  string lprjdebug;
  cmGeneratedFileStream fout;
  string local_408;
  char *local_3e8;
  char *local_3e0;
  char local_3d8;
  undefined7 uStack_3d7;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long lStack_3b0;
  string local_3a8;
  undefined1 *local_388;
  char *local_380;
  undefined1 local_378;
  undefined7 uStack_377;
  char *local_368;
  undefined8 local_360;
  char local_358;
  undefined7 uStack_357;
  undefined1 *local_348;
  char *local_340;
  undefined1 local_338;
  undefined7 uStack_337;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  char *local_2c8;
  long local_2c0;
  char local_2b8;
  undefined7 uStack_2b7;
  string *local_2a8;
  string *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  cmGeneratedFileStream local_278;
  
  local_3e8 = &local_3d8;
  local_3e0 = (char *)0x0;
  local_3d8 = '\0';
  local_388 = &local_378;
  local_380 = (char *)0x0;
  local_378 = 0;
  local_368 = &local_358;
  local_360 = 0;
  local_358 = '\0';
  local_348 = &local_338;
  local_340 = (char *)0x0;
  local_338 = 0;
  local_2c8 = &local_2b8;
  local_2c0 = 0;
  local_2b8 = '\0';
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278);
  pcVar8 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  p_Var7 = (pcVar8->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var7 != &(pcVar8->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
    local_2a0 = (string *)&this->ConfigName;
    local_2a8 = &this->WorkspacePath;
    do {
      pcVar2 = *(cmMakefile **)(**(long **)(p_Var7 + 2) + 0x28);
      GetConfigurationName_abi_cxx11_(&local_408,(cmExtraCodeLiteGenerator *)in_RSI,pcVar2);
      std::__cxx11::string::operator=(local_2a0,(string *)&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
      in_RSI = cmMakefile::GetHomeOutputDirectory(pcVar2);
      iVar3 = strcmp(pcVar4,in_RSI);
      if (iVar3 == 0) {
        pcVar5 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
        pcVar4 = local_380;
        strlen(pcVar5);
        std::__cxx11::string::_M_replace((ulong)&local_388,0,pcVar4,(ulong)pcVar5);
        pcVar5 = local_3e0;
        pcVar4 = (pcVar2->ProjectName)._M_dataplus._M_p;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)&local_3e8,0,pcVar5,(ulong)pcVar4);
        pcVar5 = cmMakefile::GetHomeDirectory(pcVar2);
        pcVar4 = local_340;
        strlen(pcVar5);
        std::__cxx11::string::_M_replace((ulong)&local_348,0,pcVar4,(ulong)pcVar5);
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_408,local_388,local_380 + (long)local_388);
        std::__cxx11::string::append((char *)&local_408);
        std::__cxx11::string::operator=((string *)&local_368,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_408,local_3e8,local_3e0 + (long)local_3e8);
        std::__cxx11::string::append((char *)&local_408);
        std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_408._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
        pcVar4 = (char *)(this->WorkspacePath)._M_string_length;
        strlen(pcVar5);
        std::__cxx11::string::_M_replace((ulong)local_2a8,0,pcVar4,(ulong)pcVar5);
        cmGeneratedFileStream::Open(&local_278,local_368,false,false);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_278,
                   "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n<CodeLite_Workspace Name=\"",0x41);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_3e8,(long)local_3e0);
        in_RSI = "\" >\n";
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" >\n",4);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      pcVar8 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    } while ((_Rb_tree_header *)p_Var7 != &(pcVar8->ProjectMap)._M_t._M_impl.super__Rb_tree_header);
  }
  p_Var7 = (pcVar8->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var7 !=
      &(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap)._M_t._M_impl
       .super__Rb_tree_header) {
    paVar1 = &local_3a8.field_2;
    do {
      pcVar2 = *(cmMakefile **)(**(long **)(p_Var7 + 2) + 0x28);
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
      std::__cxx11::string::string((string *)&local_408,pcVar4,(allocator *)&local_2e8);
      std::__cxx11::string::string
                ((string *)&local_2e8,(pcVar2->ProjectName)._M_dataplus._M_p,(allocator *)&local_328
                );
      local_3c8 = &local_3b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c8,local_408._M_dataplus._M_p,
                 local_408._M_dataplus._M_p + local_408._M_string_length);
      std::__cxx11::string::append((char *)&local_3c8);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3c8,(ulong)local_2e8._M_dataplus._M_p);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_3a8.field_2._M_allocated_capacity = *psVar10;
        local_3a8.field_2._8_8_ = plVar9[3];
        local_3a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3a8.field_2._M_allocated_capacity = *psVar10;
        local_3a8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3a8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3a8);
      local_328 = &local_318;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_318 = *plVar11;
        lStack_310 = plVar9[3];
      }
      else {
        local_318 = *plVar11;
        local_328 = (long *)*plVar9;
      }
      local_320 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,local_3b8 + 1);
      }
      cmSystemTools::RelativePath_abi_cxx11_
                (&local_3a8,(cmSystemTools *)(this->WorkspacePath)._M_dataplus._M_p,
                 (char *)local_328,(char *)plVar11);
      std::__cxx11::string::operator=((string *)&local_328,(string *)&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      CreateProjectFile(this,(vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                             (p_Var7 + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_278,"  <Project Name=\"",0x11);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_278,local_2e8._M_dataplus._M_p,
                          local_2e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" Path=\"",8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_328,local_320);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" Active=\"No\"/>\n",0x10);
      std::operator+(&local_298,"<Project Name=\"",&local_2e8);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_308 = &local_2f8;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_2f8 = *plVar11;
        lStack_2f0 = plVar9[3];
      }
      else {
        local_2f8 = *plVar11;
        local_308 = (long *)*plVar9;
      }
      local_300 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_308,(ulong)(this->ConfigName)._M_dataplus._M_p);
      local_3c8 = &local_3b8;
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        local_3b8 = *plVar11;
        lStack_3b0 = plVar9[3];
      }
      else {
        local_3b8 = *plVar11;
        local_3c8 = (long *)*plVar9;
      }
      local_3c0 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c8);
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_3a8.field_2._M_allocated_capacity = *psVar10;
        local_3a8.field_2._8_8_ = plVar9[3];
        local_3a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3a8.field_2._M_allocated_capacity = *psVar10;
        local_3a8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3a8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_3a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if (local_3c8 != &local_3b8) {
        operator_delete(local_3c8,local_3b8 + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,local_2f8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_328 != &local_318) {
        operator_delete(local_328,local_318 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 !=
             &(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap)._M_t.
              _M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_278,"  <BuildMatrix>\n    <WorkspaceConfiguration Name=\"",0x32);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_278,(this->ConfigName)._M_dataplus._M_p,
                      (this->ConfigName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\" Selected=\"yes\">\n      ",0x18);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c8,local_2c0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"    </WorkspaceConfiguration>\n  </BuildMatrix>\n</CodeLite_Workspace>\n",0x45)
  ;
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,CONCAT71(uStack_357,local_358) + 1);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388,CONCAT71(uStack_377,local_378) + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
  }
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::Generate()
{
  // Hold root tree information for creating the workspace
  std::string workspaceProjectName;
  std::string workspaceOutputDir;
  std::string workspaceFileName;
  std::string workspaceSourcePath;
  std::string lprjdebug;

  cmGeneratedFileStream fout;

  // loop projects and locate the root project.
  // and extract the information for creating the worspace
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it!= this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    const cmMakefile* mf =it->second[0]->GetMakefile();
    this->ConfigName = GetConfigurationName( mf );

    if (strcmp(mf->GetCurrentBinaryDirectory(),
               mf->GetHomeOutputDirectory()) == 0)
      {
      workspaceOutputDir   = mf->GetCurrentBinaryDirectory();
      workspaceProjectName = mf->GetProjectName();
      workspaceSourcePath  = mf->GetHomeDirectory();
      workspaceFileName    = workspaceOutputDir+"/";
      workspaceFileName   += workspaceProjectName + ".workspace";
      this->WorkspacePath = mf->GetCurrentBinaryDirectory();;

      fout.Open(workspaceFileName.c_str(), false, false);
      fout << "<?xml version=\"1.0\" encoding=\"utf-8\"?>\n"
           "<CodeLite_Workspace Name=\"" << workspaceProjectName << "\" >\n";
      }
    }

  // for each sub project in the workspace create a codelite project
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it!= this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    // retrive project information
    const cmMakefile* mf    = it->second[0]->GetMakefile();
    std::string outputDir   = mf->GetCurrentBinaryDirectory();
    std::string projectName = mf->GetProjectName();
    std::string filename    = outputDir + "/" + projectName + ".project";

    // Make the project file relative to the workspace
    filename = cmSystemTools::RelativePath(this->WorkspacePath.c_str(),
                                          filename.c_str());

    // create a project file
    this->CreateProjectFile(it->second);
    fout << "  <Project Name=\"" << projectName << "\" Path=\""
    << filename << "\" Active=\"No\"/>\n";
    lprjdebug += "<Project Name=\"" + projectName
              + "\" ConfigName=\"" + this->ConfigName + "\"/>\n";
    }

  fout << "  <BuildMatrix>\n"
       "    <WorkspaceConfiguration Name=\""
       << this->ConfigName << "\" Selected=\"yes\">\n"
       "      " << lprjdebug << ""
       "    </WorkspaceConfiguration>\n"
       "  </BuildMatrix>\n"
       "</CodeLite_Workspace>\n";
}